

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompOpEvalPredicate
               (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodeSetPtr set,int minPos,
               int maxPos,int hasNsNodes)

{
  xmlXPathCompExprPtr pxVar1;
  xmlGenericErrorFunc p_Var2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlXPathCompExprPtr comp;
  int hasNsNodes_local;
  int maxPos_local;
  int minPos_local;
  xmlNodeSetPtr set_local;
  xmlXPathStepOpPtr op_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (op->ch1 != -1) {
    pxVar1 = ctxt->comp;
    if (pxVar1->steps[op->ch1].op != XPATH_OP_PREDICATE) {
      pp_Var3 = __xmlGenericError();
      p_Var2 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar4,"xmlXPathCompOpEvalPredicate: Expected a predicate\n");
      xmlXPathErr(ctxt,10);
      return;
    }
    if (4999 < ctxt->context->depth) {
      xmlXPathErr(ctxt,0x1a);
      return;
    }
    ctxt->context->depth = ctxt->context->depth + 1;
    xmlXPathCompOpEvalPredicate(ctxt,pxVar1->steps + op->ch1,set,1,set->nodeNr,hasNsNodes);
    ctxt->context->depth = ctxt->context->depth + -1;
    if (ctxt->error != 0) {
      return;
    }
  }
  if (op->ch2 != -1) {
    xmlXPathNodeSetFilter(ctxt,set,op->ch2,minPos,maxPos,hasNsNodes);
  }
  return;
}

Assistant:

static void
xmlXPathCompOpEvalPredicate(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    xmlNodeSetPtr set,
                            int minPos, int maxPos,
			    int hasNsNodes)
{
    if (op->ch1 != -1) {
	xmlXPathCompExprPtr comp = ctxt->comp;
	/*
	* Process inner predicates first.
	*/
	if (comp->steps[op->ch1].op != XPATH_OP_PREDICATE) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompOpEvalPredicate: Expected a predicate\n");
            XP_ERROR(XPATH_INVALID_OPERAND);
	}
        if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        ctxt->context->depth += 1;
	xmlXPathCompOpEvalPredicate(ctxt, &comp->steps[op->ch1], set,
                                    1, set->nodeNr, hasNsNodes);
        ctxt->context->depth -= 1;
	CHECK_ERROR;
    }

    if (op->ch2 != -1)
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, minPos, maxPos, hasNsNodes);
}